

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi_baseline_index_impl.h
# Opt level: O0

void __thiscall
json::JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_two(JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
         *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *cost_matrix,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *mask_matrix,unsigned_long *matrix_size,vector<double,_std::allocator<double>_> *row_cover,
        vector<double,_std::allocator<double>_> *col_cover,int *step)

{
  reference pvVar1;
  reference pvVar2;
  undefined8 local_58;
  unsigned_long c_1;
  unsigned_long r_1;
  unsigned_long c;
  unsigned_long r;
  vector<double,_std::allocator<double>_> *col_cover_local;
  vector<double,_std::allocator<double>_> *row_cover_local;
  unsigned_long *matrix_size_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mask_matrix_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cost_matrix_local;
  JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
  *this_local;
  
  for (c = 0; c < *matrix_size; c = c + 1) {
    for (r_1 = 0; r_1 < *matrix_size; r_1 = r_1 + 1) {
      pvVar1 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](cost_matrix,c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,r_1);
      if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](row_cover,c);
        if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,r_1);
          if ((*pvVar2 == 0.0) && (!NAN(*pvVar2))) {
            pvVar1 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](mask_matrix,c);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](pvVar1,r_1);
            *pvVar2 = 1.0;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](row_cover,c);
            *pvVar2 = 1.0;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,r_1);
            *pvVar2 = 1.0;
          }
        }
      }
    }
  }
  for (c_1 = 0; c_1 < *matrix_size; c_1 = c_1 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](row_cover,c_1);
    *pvVar2 = 0.0;
  }
  for (local_58 = 0; local_58 < *matrix_size; local_58 = local_58 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,local_58);
    *pvVar2 = 0.0;
  }
  *step = 3;
  return;
}

Assistant:

void JEDIBaselineTreeIndex<cost_matrixModel, TreeIndex>::step_two(
    std::vector<std::vector<double> >& cost_matrix,
    std::vector<std::vector<double> >& mask_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    int& step)
{
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] == 0 && row_cover[r] == 0 && col_cover[c] == 0)
      {
        mask_matrix[r][c] = 1;
        row_cover[r] = 1;
        col_cover[c] = 1;
      }
    }
  }
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    row_cover[r] = 0;
  }
  for (unsigned long c = 0; c < matrix_size; c++)
  {
    col_cover[c] = 0;
  }
  step = 3;
}